

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::UdpFieldBaseSyntax::isKind(SyntaxKind kind)

{
  return kind == UdpSimpleField || kind == UdpEdgeField;
}

Assistant:

bool UdpFieldBaseSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::UdpEdgeField:
        case SyntaxKind::UdpSimpleField:
            return true;
        default:
            return false;
    }
}